

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O3

string * __thiscall
cfd::js::api::json::
ExecuteElementsCheckApi<cfd::js::api::json::VerifySignRequest,cfd::js::api::json::VerifySignResponse,cfd::js::api::VerifySignRequestStruct,cfd::js::api::VerifySignResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>
          *bitcoin_function,
          function<cfd::js::api::VerifySignResponseStruct_(const_cfd::js::api::VerifySignRequestStruct_&)>
          *elements_function)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  undefined8 uVar4;
  string *json_message;
  ErrorResponse res_1;
  VerifySignResponse res;
  VerifySignRequestStruct request;
  VerifySignRequest req;
  undefined1 local_2d0 [40];
  _Alloc_hider local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  _Alloc_hider local_288;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  undefined1 local_208 [32];
  undefined1 local_1e8 [16];
  pointer pFStack_1d8;
  pointer local_1d0;
  int local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  undefined1 local_1b0 [16];
  vector<cfd::js::api::json::FailSignTxIn,_std::allocator<cfd::js::api::json::FailSignTxIn>_>
  local_1a0;
  undefined1 local_180 [48];
  undefined1 auStack_150 [32];
  _Base_ptr p_Stack_130;
  size_t local_128;
  VerifySignRequestStruct local_120;
  VerifySignRequest local_b0;
  
  VerifySignRequest::VerifySignRequest(&local_b0);
  core::JsonClassBase<cfd::js::api::json::VerifySignRequest>::Deserialize
            (&local_b0.super_JsonClassBase<cfd::js::api::json::VerifySignRequest>,(string *)this);
  VerifySignRequest::ConvertToStruct(&local_120,&local_b0);
  local_2d0[0] = true;
  local_2a8._M_p = (pointer)&local_298;
  local_2d0._8_8_ = (pointer)0x0;
  local_2d0._16_4_ = 0;
  local_2d0._20_4_ = 0;
  local_2d0._24_4_ = 0;
  local_2d0._28_4_ = 0;
  local_2d0._32_4_ = 0;
  local_2a0 = 0;
  local_298._M_local_buf[0] = '\0';
  local_288._M_p = (pointer)&local_278;
  local_280 = 0;
  local_278._M_local_buf[0] = '\0';
  p_Var1 = &local_268._M_impl.super__Rb_tree_header;
  local_268._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_268._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_268._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &local_238._M_impl.super__Rb_tree_header;
  local_238._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_238._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_238._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_268._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_268._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_238._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_238._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if (local_120.is_elements == true) {
    if ((bitcoin_function->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
LAB_005f609f:
      uVar4 = std::__throw_bad_function_call();
      local_1e8._0_8_ = &PTR__VerifySignResponse_00a7e158;
      std::
      vector<cfd::js::api::json::FailSignTxIn,_std::allocator<cfd::js::api::json::FailSignTxIn>_>::
      ~vector(&local_1a0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1e8 + 8));
      pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if ((_Rb_tree_header *)pcVar3 != p_Var1) {
        operator_delete(pcVar3);
      }
      VerifySignResponseStruct::~VerifySignResponseStruct((VerifySignResponseStruct *)local_2d0);
      VerifySignRequestStruct::~VerifySignRequestStruct(&local_120);
      VerifySignRequest::~VerifySignRequest(&local_b0);
      _Unwind_Resume(uVar4);
    }
    (*bitcoin_function->_M_invoker)
              ((VerifySignResponseStruct *)local_1e8,(_Any_data *)bitcoin_function,&local_120);
  }
  else {
    if ((request_message->field_2)._M_allocated_capacity == 0) goto LAB_005f609f;
    (**(code **)((long)&request_message->field_2 + 8))(local_1e8,request_message,&local_120);
  }
  local_208._0_8_ = local_2d0._8_8_;
  local_2d0[0] = local_1e8[0];
  local_208._16_8_ = CONCAT44(local_2d0._28_4_,local_2d0._24_4_);
  local_2d0._24_4_ = SUB84(local_1d0,0);
  local_2d0._28_4_ = (undefined4)((ulong)local_1d0 >> 0x20);
  local_208._8_8_ = CONCAT44(local_2d0._20_4_,local_2d0._16_4_);
  local_2d0._8_8_ = local_1e8._8_8_;
  local_2d0._16_4_ = SUB84(pFStack_1d8,0);
  local_2d0._20_4_ = (undefined4)((ulong)pFStack_1d8 >> 0x20);
  local_1e8._8_8_ = (pointer)0x0;
  pFStack_1d8 = (pointer)0x0;
  local_1d0 = (pointer)0x0;
  std::vector<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>::
  ~vector((vector<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
           *)local_208);
  local_2d0._32_4_ = local_1c8;
  std::__cxx11::string::operator=((string *)&local_2a8,(string *)local_1c0._M_local_buf);
  std::__cxx11::string::operator=((string *)&local_288,(string *)&local_1a0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_268);
  if ((_Base_ptr)local_180._16_8_ != (_Base_ptr)0x0) {
    local_268._M_impl.super__Rb_tree_header._M_header._M_color = local_180._8_4_;
    local_268._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_180._16_8_;
    local_268._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_180._24_8_;
    local_268._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)local_180._32_8_;
    *(_Rb_tree_header **)(local_180._16_8_ + 8) = p_Var1;
    local_268._M_impl.super__Rb_tree_header._M_node_count = local_180._40_8_;
    local_180._16_8_ = (_Base_ptr)0x0;
    local_180._40_8_ = 0;
    local_180._24_8_ = (_Base_ptr)(local_180 + 8);
    local_180._32_8_ = (_Base_ptr)(local_180 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&local_238);
  if ((_Base_ptr)auStack_150._16_8_ != (_Base_ptr)0x0) {
    local_238._M_impl.super__Rb_tree_header._M_header._M_color = auStack_150._8_4_;
    local_238._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)auStack_150._16_8_;
    local_238._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)auStack_150._24_8_;
    local_238._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_130;
    *(_Rb_tree_header **)(auStack_150._16_8_ + 8) = p_Var2;
    local_238._M_impl.super__Rb_tree_header._M_node_count = local_128;
    auStack_150._16_8_ = (_Base_ptr)0x0;
    local_128 = 0;
    auStack_150._24_8_ = (_Base_ptr)(auStack_150 + 8);
    p_Stack_130 = (_Base_ptr)(auStack_150 + 8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_150);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_180);
  if (local_1a0.
      super__Vector_base<cfd::js::api::json::FailSignTxIn,_std::allocator<cfd::js::api::json::FailSignTxIn>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&local_1a0.
                super__Vector_base<cfd::js::api::json::FailSignTxIn,_std::allocator<cfd::js::api::json::FailSignTxIn>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_1a0.
                    super__Vector_base<cfd::js::api::json::FailSignTxIn,_std::allocator<cfd::js::api::json::FailSignTxIn>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((undefined1 *)local_1c0._M_allocated_capacity != local_1b0) {
    operator_delete((void *)local_1c0._M_allocated_capacity);
  }
  std::vector<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>::
  ~vector((vector<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
           *)(local_1e8 + 8));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (local_2d0._32_4_ == 0) {
    VerifySignResponse::VerifySignResponse((VerifySignResponse *)local_1e8);
    VerifySignResponse::ConvertFromStruct
              ((VerifySignResponse *)local_1e8,(VerifySignResponseStruct *)local_2d0);
    core::JsonClassBase<cfd::js::api::json::VerifySignResponse>::Serialize_abi_cxx11_
              ((string *)local_208,
               (JsonClassBase<cfd::js::api::json::VerifySignResponse> *)local_1e8);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_208);
    if ((pointer)local_208._0_8_ != (pointer)(local_208 + 0x10)) {
      operator_delete((void *)local_208._0_8_);
    }
    local_1e8._0_8_ = &PTR__VerifySignResponse_00a7e158;
    std::vector<cfd::js::api::json::FailSignTxIn,_std::allocator<cfd::js::api::json::FailSignTxIn>_>
    ::~vector(&local_1a0);
  }
  else {
    ErrorResponse::ConvertFromStruct
              ((ErrorResponse *)local_1e8,(InnerErrorResponseStruct *)(local_2d0 + 0x20));
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
              ((string *)local_208,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)local_1e8
              );
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_208);
    if ((pointer)local_208._0_8_ != (pointer)(local_208 + 0x10)) {
      operator_delete((void *)local_208._0_8_);
    }
    local_1e8._0_8_ = &PTR__ErrorResponseBase_00a78a38;
    InnerErrorResponse::~InnerErrorResponse((InnerErrorResponse *)local_1b0);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1e8 + 8));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_238);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_p != &local_278) {
    operator_delete(local_288._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_p != &local_298) {
    operator_delete(local_2a8._M_p);
  }
  std::vector<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>::
  ~vector((vector<cfd::js::api::FailSignTxInStruct,_std::allocator<cfd::js::api::FailSignTxInStruct>_>
           *)(local_2d0 + 8));
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_120.ignore_items._M_t);
  std::
  vector<cfd::js::api::VerifySignTxInUtxoDataStruct,_std::allocator<cfd::js::api::VerifySignTxInUtxoDataStruct>_>
  ::~vector(&local_120.txins);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.tx._M_dataplus._M_p != &local_120.tx.field_2) {
    operator_delete(local_120.tx._M_dataplus._M_p);
  }
  VerifySignRequest::~VerifySignRequest(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::string ExecuteElementsCheckApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        bitcoin_function,  // NOLINT
    std::function<ResponseStructType(const RequestStructType &)>
        elements_function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response;
  if (request.is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
    response = elements_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_ELEMENTS
  } else {
#ifndef CFD_DISABLE_BITCOIN
    response = bitcoin_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_BITCOIN
  }
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}